

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

void __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
GenericValue<rapidjson::CrtAllocator>
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *rhs,CrtAllocator *allocator,
          bool copyConstStrings)

{
  ushort uVar1;
  uint uVar2;
  SizeType len;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar3;
  Ch *pCVar4;
  ushort uVar5;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *rhs_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_00;
  ulong uVar6;
  bool bVar7;
  GenericStringRef<char> local_40;
  
  uVar1 = (rhs->data_).f.flags;
  uVar5 = uVar1 & 7;
  if (uVar5 == 5) {
    if (uVar1 != 0x405 || copyConstStrings) {
      pCVar4 = GetString(rhs);
      len = GetStringLength(rhs);
      GenericStringRef<char>::GenericStringRef(&local_40,pCVar4,len);
      SetStringRaw(this,&local_40,allocator);
      return;
    }
    (this->data_).f.flags = 0x405;
  }
  else {
    if (uVar5 == 4) {
      uVar2 = (rhs->data_).s.length;
      uVar6 = (ulong)uVar2;
      pGVar3 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
               CrtAllocator::Malloc(allocator,uVar6 << 4);
      rhs_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
               ((ulong)(rhs->data_).s.str & 0xffffffffffff);
      this_00 = pGVar3;
      while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
        GenericValue<rapidjson::CrtAllocator>(this_00,rhs_00,allocator,copyConstStrings);
        this_00 = this_00 + 1;
        rhs_00 = rhs_00 + 1;
      }
      (this->data_).s.hashcode = uVar2;
      (this->data_).s.length = uVar2;
      (this->data_).s.str = (Ch *)((ulong)pGVar3 | 0x4000000000000);
      return;
    }
    if (uVar5 == 3) {
      DoCopyMembers<rapidjson::CrtAllocator>(this,rhs,allocator,copyConstStrings);
      return;
    }
    (this->data_).f.flags = uVar1;
  }
  pCVar4 = (rhs->data_).s.str;
  (this->data_).n = (rhs->data_).n;
  (this->data_).s.str = pCVar4;
  return;
}

Assistant:

GenericValue(const GenericValue<Encoding,SourceAllocator>& rhs, Allocator& allocator, bool copyConstStrings = false) {
        switch (rhs.GetType()) {
        case kObjectType:
            DoCopyMembers(rhs, allocator, copyConstStrings);
            break;
        case kArrayType: {
                SizeType count = rhs.data_.a.size;
                GenericValue* le = reinterpret_cast<GenericValue*>(allocator.Malloc(count * sizeof(GenericValue)));
                const GenericValue<Encoding,SourceAllocator>* re = rhs.GetElementsPointer();
                for (SizeType i = 0; i < count; i++)
                    new (&le[i]) GenericValue(re[i], allocator, copyConstStrings);
                data_.f.flags = kArrayFlag;
                data_.a.size = data_.a.capacity = count;
                SetElementsPointer(le);
            }
            break;
        case kStringType:
            if (rhs.data_.f.flags == kConstStringFlag && !copyConstStrings) {
                data_.f.flags = rhs.data_.f.flags;
                data_  = *reinterpret_cast<const Data*>(&rhs.data_);
            }
            else
                SetStringRaw(StringRef(rhs.GetString(), rhs.GetStringLength()), allocator);
            break;
        default:
            data_.f.flags = rhs.data_.f.flags;
            data_  = *reinterpret_cast<const Data*>(&rhs.data_);
            break;
        }
    }